

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void iidentity32_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  __m128i *palVar1;
  __m128i *palVar2;
  int iVar3;
  longlong lVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  lVar8 = 0;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    palVar1 = in + lVar8;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 1;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 1;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 2;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 2;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 3;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 3;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 4;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 4;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 5;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 5;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 6;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 6;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 7;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 7;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 8;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 8;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 9;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 9;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 10;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 10;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 0xb;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0xb;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 0xc;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0xc;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 0xd;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0xd;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 0xe;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0xe;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    palVar1 = in + lVar8 + 0xf;
    iVar7 = *(int *)((long)*palVar1 + 4);
    lVar4 = (*palVar1)[1];
    iVar3 = *(int *)((long)*palVar1 + 0xc);
    palVar2 = out + lVar8 + 0xf;
    *(int *)*palVar2 = (int)(*palVar1)[0] << 2;
    *(int *)((long)*palVar2 + 4) = iVar7 << 2;
    *(int *)(*palVar2 + 1) = (int)lVar4 << 2;
    *(int *)((long)*palVar2 + 0xc) = iVar3 << 2;
    lVar8 = 0x10;
    bVar5 = false;
  } while (bVar6);
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    local_48 = 0x20 << ((byte)iVar7 & 0x1f);
    local_38 = -local_48;
    local_48 = local_48 + -1;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    iStack_34 = local_38;
    iStack_30 = local_38;
    iStack_2c = local_38;
    round_shift_8x8(out,out_shift);
    round_shift_8x8(out + 0x10,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_38,(__m128i *)&local_48,0x20);
  }
  return;
}

Assistant:

static void iidentity32_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  (void)bit;
  for (int i = 0; i < 32; i += 16) {
    out[i] = _mm_slli_epi32(in[i], 2);
    out[i + 1] = _mm_slli_epi32(in[i + 1], 2);
    out[i + 2] = _mm_slli_epi32(in[i + 2], 2);
    out[i + 3] = _mm_slli_epi32(in[i + 3], 2);
    out[i + 4] = _mm_slli_epi32(in[i + 4], 2);
    out[i + 5] = _mm_slli_epi32(in[i + 5], 2);
    out[i + 6] = _mm_slli_epi32(in[i + 6], 2);
    out[i + 7] = _mm_slli_epi32(in[i + 7], 2);
    out[i + 8] = _mm_slli_epi32(in[i + 8], 2);
    out[i + 9] = _mm_slli_epi32(in[i + 9], 2);
    out[i + 10] = _mm_slli_epi32(in[i + 10], 2);
    out[i + 11] = _mm_slli_epi32(in[i + 11], 2);
    out[i + 12] = _mm_slli_epi32(in[i + 12], 2);
    out[i + 13] = _mm_slli_epi32(in[i + 13], 2);
    out[i + 14] = _mm_slli_epi32(in[i + 14], 2);
    out[i + 15] = _mm_slli_epi32(in[i + 15], 2);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    round_shift_8x8(out + 16, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}